

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
::iterator::skip_empty_or_deleted(iterator *this)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [11];
  undefined1 auVar9 [12];
  undefined1 auVar10 [13];
  undefined1 auVar11 [14];
  char *pcVar12;
  slot_type *psVar13;
  uint uVar14;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  
  pcVar12 = this->ctrl_;
  if (pcVar12 != (char *)0x0) {
    psVar13 = (this->field_1).slot_;
    while (*pcVar12 < -1) {
      iVar4 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                     CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
      iVar5 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                     CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
      iVar6 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                     CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
      iVar7 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                     CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
      in_XMM1_Ba = -(*pcVar12 < (char)iVar4);
      in_XMM1_Bb = -(pcVar12[1] < (char)((uint)iVar4 >> 8));
      in_XMM1_Bc = -(pcVar12[2] < (char)((uint)iVar4 >> 0x10));
      in_XMM1_Bd = -(pcVar12[3] < (char)((uint)iVar4 >> 0x18));
      in_XMM1_Be = -(pcVar12[4] < (char)iVar5);
      in_XMM1_Bf = -(pcVar12[5] < (char)((uint)iVar5 >> 8));
      in_XMM1_Bg = -(pcVar12[6] < (char)((uint)iVar5 >> 0x10));
      in_XMM1_Bh = -(pcVar12[7] < (char)((uint)iVar5 >> 0x18));
      in_XMM1_Bi = -(pcVar12[8] < (char)iVar6);
      in_XMM1_Bj = -(pcVar12[9] < (char)((uint)iVar6 >> 8));
      in_XMM1_Bk = -(pcVar12[10] < (char)((uint)iVar6 >> 0x10));
      in_XMM1_Bl = -(pcVar12[0xb] < (char)((uint)iVar6 >> 0x18));
      in_XMM1_Bm = -(pcVar12[0xc] < (char)iVar7);
      in_XMM1_Bn = -(pcVar12[0xd] < (char)((uint)iVar7 >> 8));
      in_XMM1_Bo = -(pcVar12[0xe] < (char)((uint)iVar7 >> 0x10));
      in_XMM1_Bp = -(pcVar12[0xf] < (char)((uint)iVar7 >> 0x18));
      auVar2[1] = in_XMM1_Bb;
      auVar2[0] = in_XMM1_Ba;
      auVar2[2] = in_XMM1_Bc;
      auVar2[3] = in_XMM1_Bd;
      auVar2[4] = in_XMM1_Be;
      auVar2[5] = in_XMM1_Bf;
      auVar2[6] = in_XMM1_Bg;
      auVar2[7] = in_XMM1_Bh;
      auVar2[8] = in_XMM1_Bi;
      auVar2[9] = in_XMM1_Bj;
      auVar2[10] = in_XMM1_Bk;
      auVar2[0xb] = in_XMM1_Bl;
      auVar2[0xc] = in_XMM1_Bm;
      auVar2[0xd] = in_XMM1_Bn;
      auVar2[0xe] = in_XMM1_Bo;
      auVar2[0xf] = in_XMM1_Bp;
      auVar3[1] = in_XMM1_Bb;
      auVar3[0] = in_XMM1_Ba;
      auVar3[2] = in_XMM1_Bc;
      auVar3[3] = in_XMM1_Bd;
      auVar3[4] = in_XMM1_Be;
      auVar3[5] = in_XMM1_Bf;
      auVar3[6] = in_XMM1_Bg;
      auVar3[7] = in_XMM1_Bh;
      auVar3[8] = in_XMM1_Bi;
      auVar3[9] = in_XMM1_Bj;
      auVar3[10] = in_XMM1_Bk;
      auVar3[0xb] = in_XMM1_Bl;
      auVar3[0xc] = in_XMM1_Bm;
      auVar3[0xd] = in_XMM1_Bn;
      auVar3[0xe] = in_XMM1_Bo;
      auVar3[0xf] = in_XMM1_Bp;
      auVar11[1] = in_XMM1_Bd;
      auVar11[0] = in_XMM1_Bc;
      auVar11[2] = in_XMM1_Be;
      auVar11[3] = in_XMM1_Bf;
      auVar11[4] = in_XMM1_Bg;
      auVar11[5] = in_XMM1_Bh;
      auVar11[6] = in_XMM1_Bi;
      auVar11[7] = in_XMM1_Bj;
      auVar11[8] = in_XMM1_Bk;
      auVar11[9] = in_XMM1_Bl;
      auVar11[10] = in_XMM1_Bm;
      auVar11[0xb] = in_XMM1_Bn;
      auVar11[0xc] = in_XMM1_Bo;
      auVar11[0xd] = in_XMM1_Bp;
      auVar10[1] = in_XMM1_Be;
      auVar10[0] = in_XMM1_Bd;
      auVar10[2] = in_XMM1_Bf;
      auVar10[3] = in_XMM1_Bg;
      auVar10[4] = in_XMM1_Bh;
      auVar10[5] = in_XMM1_Bi;
      auVar10[6] = in_XMM1_Bj;
      auVar10[7] = in_XMM1_Bk;
      auVar10[8] = in_XMM1_Bl;
      auVar10[9] = in_XMM1_Bm;
      auVar10[10] = in_XMM1_Bn;
      auVar10[0xb] = in_XMM1_Bo;
      auVar10[0xc] = in_XMM1_Bp;
      auVar9[1] = in_XMM1_Bf;
      auVar9[0] = in_XMM1_Be;
      auVar9[2] = in_XMM1_Bg;
      auVar9[3] = in_XMM1_Bh;
      auVar9[4] = in_XMM1_Bi;
      auVar9[5] = in_XMM1_Bj;
      auVar9[6] = in_XMM1_Bk;
      auVar9[7] = in_XMM1_Bl;
      auVar9[8] = in_XMM1_Bm;
      auVar9[9] = in_XMM1_Bn;
      auVar9[10] = in_XMM1_Bo;
      auVar9[0xb] = in_XMM1_Bp;
      auVar8[1] = in_XMM1_Bg;
      auVar8[0] = in_XMM1_Bf;
      auVar8[2] = in_XMM1_Bh;
      auVar8[3] = in_XMM1_Bi;
      auVar8[4] = in_XMM1_Bj;
      auVar8[5] = in_XMM1_Bk;
      auVar8[6] = in_XMM1_Bl;
      auVar8[7] = in_XMM1_Bm;
      auVar8[8] = in_XMM1_Bn;
      auVar8[9] = in_XMM1_Bo;
      auVar8[10] = in_XMM1_Bp;
      uVar14 = (ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB141(auVar11 >> 7,0) & 1) << 2 |
                        (ushort)(SUB131(auVar10 >> 7,0) & 1) << 3 |
                        (ushort)(SUB121(auVar9 >> 7,0) & 1) << 4 |
                        (ushort)(SUB111(auVar8 >> 7,0) & 1) << 5 |
                        (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                 CONCAT18(in_XMM1_Bo,
                                                          CONCAT17(in_XMM1_Bn,
                                                                   CONCAT16(in_XMM1_Bm,
                                                                            CONCAT15(in_XMM1_Bl,
                                                                                     CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                        (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                 CONCAT17(in_XMM1_Bo,
                                                          CONCAT16(in_XMM1_Bn,
                                                                   CONCAT15(in_XMM1_Bm,
                                                                            CONCAT14(in_XMM1_Bl,
                                                                                     CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                       7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
      uVar1 = 0;
      if (uVar14 != 0) {
        for (; (uVar14 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
        }
      }
      pcVar12 = pcVar12 + uVar1;
      this->ctrl_ = pcVar12;
      psVar13 = psVar13 + uVar1;
      (this->field_1).slot_ = psVar13;
    }
  }
  return;
}

Assistant:

void skip_empty_or_deleted() {
            PHMAP_IF_CONSTEXPR (!std_alloc_t::value) {
                // ctrl_ could be nullptr
                if (!ctrl_)
                    return;
            }
            while (IsEmptyOrDeleted(*ctrl_)) {
                // ctrl is not necessarily aligned to Group::kWidth. It is also likely
                // to read past the space for ctrl bytes and into slots. This is ok
                // because ctrl has sizeof() == 1 and slot has sizeof() >= 1 so there
                // is no way to read outside the combined slot array.
                uint32_t shift = Group{ctrl_}.CountLeadingEmptyOrDeleted();
                ctrl_ += shift;
                slot_ += shift;
            }
        }